

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

IfcMatrix4 *
Assimp::IFC::ProjectOntoPlane
          (IfcMatrix4 *__return_storage_ptr__,
          vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out_contour,
          TempMesh *in_mesh,bool *ok,IfcVector3 *nor_out)

{
  pointer *ppaVar1;
  pointer paVar2;
  iterator __position;
  pointer paVar3;
  IfcVector2 *vv;
  long lVar4;
  pointer paVar5;
  IfcVector3 *x;
  pointer paVar6;
  long lVar7;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2_1;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  ulong uVar13;
  double dVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  ulong uVar25;
  double dVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> out_contour2;
  double local_188;
  IfcMatrix3 local_138;
  double local_e8;
  ulong uStack_e0;
  double local_d8;
  ulong uStack_d0;
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  ulong uStack_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  aiVector2t<double> local_40;
  
  *ok = true;
  DerivePlaneCoordinateSpace(&local_138,in_mesh,ok,nor_out);
  dVar21 = local_138.a2;
  dVar8 = local_138.a1;
  if (*ok == false) {
    __return_storage_ptr__->a1 = 1.0;
    __return_storage_ptr__->a2 = 0.0;
    __return_storage_ptr__->a3 = 0.0;
    __return_storage_ptr__->a4 = 0.0;
    __return_storage_ptr__->b1 = 0.0;
    __return_storage_ptr__->b2 = 1.0;
    __return_storage_ptr__->b3 = 0.0;
    __return_storage_ptr__->b4 = 0.0;
    __return_storage_ptr__->c1 = 0.0;
    __return_storage_ptr__->c2 = 0.0;
    __return_storage_ptr__->c3 = 1.0;
    __return_storage_ptr__->c4 = 0.0;
    __return_storage_ptr__->d1 = 0.0;
    __return_storage_ptr__->d2 = 0.0;
    __return_storage_ptr__->d3 = 0.0;
    __return_storage_ptr__->d4 = 1.0;
  }
  else {
    dVar10 = local_138.b1 * 0.0;
    dVar18 = local_138.b2 * 0.0;
    dVar20 = local_138.b3 * 0.0;
    local_188 = 0.0;
    if (1e-05 <= ABS(dVar20 * local_138.c2 * 0.0 +
                     local_138.c1 * dVar20 * -0.0 +
                     dVar18 * local_138.c1 * 0.0 +
                     local_138.c3 * dVar18 * -0.0 +
                     dVar10 * local_138.c3 * 0.0 +
                     local_138.c2 * dVar10 * -0.0 +
                     ((local_138.a3 * local_138.b2 * 0.0 * 0.0 +
                      local_138.a3 * local_138.b1 * -0.0 * 0.0 +
                      local_138.a3 * local_138.b1 * local_138.c2 +
                      local_138.c2 * local_138.a3 * 0.0 * -0.0 +
                      local_138.a3 * 0.0 * local_138.c1 * 0.0 +
                      local_138.a2 * local_138.b1 * 0.0 * 0.0 +
                      ((local_138.a2 * 0.0 * local_138.c3 * 0.0 +
                       local_138.c1 * local_138.a2 * 0.0 * -0.0 +
                       local_138.a2 * local_138.b3 * local_138.c1 +
                       local_138.a2 * local_138.b3 * -0.0 * 0.0 +
                       local_138.c3 * local_138.a1 * 0.0 * -0.0 +
                       local_138.a1 * 0.0 * local_138.c2 * 0.0 +
                       ((local_138.a1 * local_138.b3 * 0.0 * 0.0 +
                        local_138.a1 * local_138.b2 * -0.0 * 0.0 +
                        local_138.a1 * local_138.b2 * local_138.c3) -
                       local_138.a1 * local_138.b3 * local_138.c2)) -
                      local_138.a2 * local_138.b1 * local_138.c3)) -
                     local_138.a3 * local_138.b2 * local_138.c1) + -1.0)) {
      __assert_fail("std::fabs(det-1) < 1e-5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x42e,
                    "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                   );
    }
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (out_contour,
               ((long)(in_mesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(in_mesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    paVar6 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar2 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar6 == paVar2) {
      local_98 = -20000000000.0;
      uStack_90 = 0;
      dVar24 = 10000000000.0;
      local_a8 = -10000000000.0;
      local_b8 = -10000000000.0;
      dVar16 = 10000000000.0;
    }
    else {
      local_b8 = -10000000000.0;
      uVar23 = 0;
      dVar16 = 10000000000.0;
      local_188 = 0.0;
      dVar24 = 10000000000.0;
      uVar25 = 0;
      local_e8 = 10000000000.0;
      uVar15 = 0;
      local_a8 = -10000000000.0;
      uVar22 = 0;
      local_c8 = -10000000000.0;
      uVar27 = 0;
      do {
        dVar14 = paVar6->x;
        dVar19 = paVar6->y;
        local_98 = paVar6->z;
        local_d8 = local_138.a3 * local_98 + dVar8 * dVar14 + dVar21 * dVar19;
        local_88 = local_d8 + 0.0;
        uStack_90 = 0;
        local_78 = local_138.b3 * local_98 + local_138.b1 * dVar14 + local_138.b2 * dVar19;
        local_138.a2 = local_78 + 0.0;
        uStack_50 = 0;
        __position._M_current =
             (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_58 = local_138.a2;
        if (__position._M_current ==
            (out_contour->
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uStack_d0 = 0;
          uStack_70 = 0;
          uStack_80 = 0;
          local_138.a1 = local_88;
          uStack_e0 = uVar15;
          uStack_c0 = uVar27;
          uStack_b0 = uVar23;
          uStack_a0 = uVar22;
          local_68 = dVar24;
          uStack_60 = uVar25;
          local_48 = dVar19;
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out_contour,
                     __position,(aiVector2t<double> *)&local_138);
          uVar13 = uStack_80;
          uVar15 = uStack_e0;
          uVar22 = uStack_a0;
          uVar23 = uStack_b0;
          dVar24 = local_68;
          uVar25 = uStack_60;
          uVar27 = uStack_c0;
          dVar19 = local_48;
          uVar28 = uStack_d0;
          uVar29 = uStack_70;
        }
        else {
          (__position._M_current)->x = local_88;
          (__position._M_current)->y = local_138.a2;
          ppaVar1 = &(out_contour->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          uVar13 = 0;
          uVar28 = 0;
          uVar29 = 0;
        }
        dVar19 = local_98 * local_138.c3 + dVar14 * local_138.c1 + dVar19 * local_138.c2;
        dVar16 = (double)(-(ulong)(dVar16 < local_d8) & (ulong)dVar16 |
                         ~-(ulong)(dVar16 < local_d8) & (ulong)local_88);
        dVar24 = (double)(-(ulong)(dVar24 < local_78) & (ulong)dVar24 |
                         ~-(ulong)(dVar24 < local_78) & (ulong)local_58);
        uVar25 = uVar25 | ~uVar25 & uStack_50;
        dVar14 = dVar19 + 0.0;
        local_e8 = (double)(-(ulong)(local_e8 < dVar19) & (ulong)local_e8 |
                           ~-(ulong)(local_e8 < dVar19) & (ulong)dVar14);
        uVar15 = uVar15 | ~uVar15 & uStack_90;
        local_b8 = (double)(-(ulong)(local_d8 < local_b8) & (ulong)local_b8 |
                           ~-(ulong)(local_d8 < local_b8) & (ulong)local_88);
        uVar23 = uVar28 & uVar23 | ~uVar28 & uVar13;
        local_188 = local_188 + dVar14;
        local_a8 = (double)(-(ulong)(local_78 < local_a8) & (ulong)local_a8 |
                           ~-(ulong)(local_78 < local_a8) & (ulong)local_58);
        uVar22 = uVar29 & uVar22 | ~uVar29 & uStack_50;
        uVar27 = uStack_90 & uVar27;
        local_c8 = (double)(-(ulong)(dVar19 < local_c8) & (ulong)local_c8 |
                           ~-(ulong)(dVar19 < local_c8) & (ulong)dVar14);
        paVar6 = paVar6 + 1;
      } while (paVar6 != paVar2);
      local_98 = (local_c8 - local_e8) + 1e-08;
      uStack_90 = uVar27;
    }
    lVar4 = ((long)(in_mesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(in_mesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    paVar3 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (paVar5 = (out_contour->
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start; paVar5 != paVar3; paVar5 = paVar5 + 1) {
      dVar19 = (paVar5->x - dVar16) / (local_b8 - dVar16);
      dVar12 = (paVar5->y - dVar24) / (local_a8 - dVar24);
      dVar14 = 0.0;
      if (0.0 <= dVar19) {
        dVar14 = dVar19;
      }
      dVar19 = 0.0;
      if (0.0 <= dVar12) {
        dVar19 = dVar12;
      }
      dVar12 = 1.0;
      if (dVar14 <= 1.0) {
        dVar12 = dVar14;
      }
      dVar14 = 1.0;
      if (dVar19 <= 1.0) {
        dVar14 = dVar19;
      }
      paVar5->x = dVar12;
      paVar5->y = dVar14;
    }
    dVar19 = 1.0 / (local_b8 - dVar16);
    dVar26 = 1.0 / (local_a8 - dVar24);
    dVar17 = -local_188 /
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    local_78 = local_138.c1 * 0.0;
    local_e8 = -dVar16 * dVar19 * 0.0;
    local_c8 = dVar8 * dVar19 + dVar10 + local_78 + local_e8;
    local_88 = local_138.c2 * 0.0;
    local_d8 = dVar21 * dVar19 + dVar18 + local_88 + local_e8;
    dVar14 = local_138.c3 * 0.0;
    local_e8 = local_138.a3 * dVar19 + dVar20 + dVar14 + local_e8;
    local_b8 = dVar19 * 0.0 + 0.0 + 0.0 + -dVar16 * dVar19;
    dVar16 = -dVar24 * dVar26 * 0.0;
    dVar19 = local_138.b1 * dVar26 + dVar8 * 0.0 + local_78 + dVar16;
    dVar12 = local_138.b2 * dVar26 + dVar21 * 0.0 + local_88 + dVar16;
    dVar16 = local_138.b3 * dVar26 + local_138.a3 * 0.0 + dVar14 + dVar16;
    local_a8 = dVar26 * 0.0 + 0.0 + -dVar24 * dVar26;
    dVar10 = dVar8 * 0.0 + dVar10;
    dVar18 = dVar21 * 0.0 + dVar18;
    dVar20 = local_138.a3 * 0.0 + dVar20;
    dVar8 = dVar17 * 0.0;
    dVar24 = local_138.c1 + dVar10 + dVar8;
    dVar21 = local_138.c2 + dVar18 + dVar8;
    dVar8 = local_138.c3 + dVar20 + dVar8;
    local_138.a1 = 0.0;
    local_138.a2 = 0.0;
    dVar17 = dVar17 + 0.0;
    local_138.a3 = 0.0;
    paVar6 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar2 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar6 != paVar2) {
      do {
        local_58 = paVar6->x;
        local_68 = paVar6->y;
        dVar26 = paVar6->z;
        local_40.x = local_e8 * dVar26 + local_c8 * local_58 + local_d8 * local_68 + local_b8;
        local_40.y = dVar16 * dVar26 + dVar19 * local_58 + dVar12 * local_68 + local_a8;
        if (local_138.a2 == local_138.a3) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_138,
                     (iterator)local_138.a2,&local_40);
        }
        else {
          *(double *)local_138.a2 = local_40.x;
          *(double *)((long)local_138.a2 + 8) = local_40.y;
          local_138.a2 = (double)((long)local_138.a2 + 0x10);
        }
        if (local_98 <= ABS(dVar26 * dVar8 + local_58 * dVar24 + local_68 * dVar21 + dVar17)) {
          __assert_fail("std::fabs(vv.z) < vmax.z + 1e-8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x46a,
                        "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                       );
        }
        paVar6 = paVar6 + 1;
      } while (paVar6 != paVar2);
    }
    paVar5 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(out_contour->
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)paVar5;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 4;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      lVar7 = 8;
      do {
        dVar26 = *(double *)((long)paVar5 + lVar7 + -8) -
                 *(double *)((long)local_138.a1 + lVar7 + -8);
        dVar11 = *(double *)((long)&paVar5->x + lVar7) - *(double *)((long)local_138.a1 + lVar7);
        if (1e-06 <= dVar26 * dVar26 + dVar11 * dVar11) {
          __assert_fail("(out_contour[i]-out_contour2[i]).SquareLength() < 1e-6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x46e,
                        "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                       );
        }
        lVar7 = lVar7 + 0x10;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    __return_storage_ptr__->a1 = local_c8;
    __return_storage_ptr__->a2 = local_d8;
    __return_storage_ptr__->a3 = local_e8;
    __return_storage_ptr__->a4 = local_b8;
    __return_storage_ptr__->b1 = dVar19;
    __return_storage_ptr__->b2 = dVar12;
    __return_storage_ptr__->b3 = dVar16;
    __return_storage_ptr__->b4 = local_a8;
    __return_storage_ptr__->c1 = dVar24;
    __return_storage_ptr__->c2 = dVar21;
    __return_storage_ptr__->c3 = dVar8;
    __return_storage_ptr__->c4 = dVar17;
    __return_storage_ptr__->d1 = local_78 + dVar10 + 0.0;
    __return_storage_ptr__->d2 = local_88 + dVar18 + 0.0;
    __return_storage_ptr__->d3 = dVar14 + dVar20 + 0.0;
    __return_storage_ptr__->d4 = 1.0;
    if ((void *)local_138.a1 != (void *)0x0) {
      operator_delete((void *)local_138.a1,(long)local_138.a3 - (long)local_138.a1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IfcMatrix4 ProjectOntoPlane(std::vector<IfcVector2>& out_contour, const TempMesh& in_mesh,
    bool &ok, IfcVector3& nor_out)
{
    const std::vector<IfcVector3>& in_verts = in_mesh.mVerts;
    ok = true;

    IfcMatrix4 m = IfcMatrix4(DerivePlaneCoordinateSpace(in_mesh, ok, nor_out));
    if(!ok) {
        return IfcMatrix4();
    }
#ifdef ASSIMP_BUILD_DEBUG
    const IfcFloat det = m.Determinant();
    ai_assert(std::fabs(det-1) < 1e-5);
#endif

    IfcFloat zcoord = 0;
    out_contour.reserve(in_verts.size());


    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);

    // Project all points into the new coordinate system, collect min/max verts on the way
    for(const IfcVector3& x : in_verts) {
        const IfcVector3 vv = m * x;
        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).

        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }
        zcoord += vv.z;
        vmin = std::min(vv, vmin);
        vmax = std::max(vv, vmax);

        out_contour.push_back(IfcVector2(vv.x,vv.y));
    }

    zcoord /= in_verts.size();

    // Further improve the projection by mapping the entire working set into
    // [0,1] range. This gives us a consistent data range so all epsilons
    // used below can be constants.
    vmax -= vmin;
    for(IfcVector2& vv : out_contour) {
        vv.x  = (vv.x - vmin.x) / vmax.x;
        vv.y  = (vv.y - vmin.y) / vmax.y;

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);
    }

    IfcMatrix4 mult;
    mult.a1 = static_cast<IfcFloat>(1.0) / vmax.x;
    mult.b2 = static_cast<IfcFloat>(1.0) / vmax.y;

    mult.a4 = -vmin.x * mult.a1;
    mult.b4 = -vmin.y * mult.b2;
    mult.c4 = -zcoord;
    m = mult * m;

    // debug code to verify correctness
#ifdef ASSIMP_BUILD_DEBUG
    std::vector<IfcVector2> out_contour2;
    for(const IfcVector3& x : in_verts) {
        const IfcVector3& vv = m * x;

        out_contour2.push_back(IfcVector2(vv.x,vv.y));
        ai_assert(std::fabs(vv.z) < vmax.z + 1e-8);
    }

    for(size_t i = 0; i < out_contour.size(); ++i) {
        ai_assert((out_contour[i]-out_contour2[i]).SquareLength() < 1e-6);
    }
#endif

    return m;
}